

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,VirtualInterfaceType *type,string_view param_2)

{
  FormatBuffer *pFVar1;
  char *begin;
  InstanceBodySymbol *pIVar2;
  size_type sVar3;
  pointer ppPVar4;
  long *plVar5;
  ulong uVar6;
  ModportSymbol *pMVar7;
  Definition *pDVar8;
  Type *type_00;
  ConstantValue *this_00;
  long lVar9;
  ulong uVar10;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string local_58;
  VirtualInterfaceType *local_38;
  
  pFVar1 = (this->buffer)._M_t.
           super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
           _M_t.
           super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
           super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  pDVar8 = InstanceSymbol::getDefinition(type->iface);
  begin = (pDVar8->name)._M_str;
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)pFVar1,begin,begin + (pDVar8->name)._M_len);
  pIVar2 = type->iface->body;
  sVar3 = (pIVar2->parameters).size_;
  if (sVar3 != 0) {
    ppPVar4 = (pIVar2->parameters).data_;
    local_38 = type;
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"#(","");
    lVar9 = 0;
    do {
      plVar5 = *(long **)((long)ppPVar4 + lVar9);
      local_58._M_string_length = *(size_type *)(*plVar5 + 8);
      local_58._M_dataplus._M_p = *(pointer *)(*plVar5 + 0x10);
      fmt.size_ = 3;
      fmt.data_ = "{}=";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_58;
      args.desc_ = 0xd;
      ::fmt::v9::detail::vformat_to<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
                 (locale_ref)0x0);
      if (*(int *)*plVar5 == 0x26) {
        type_00 = DeclaredType::getType((DeclaredType *)((int *)*plVar5 + 0x14));
        append(this,type_00);
      }
      else {
        if ((((ParameterSymbol *)*plVar5)->super_ValueSymbol).super_Symbol.kind != Parameter) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,
                     "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ParameterSymbol]");
        }
        pFVar1 = (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
        this_00 = ParameterSymbol::getValue((ParameterSymbol *)*plVar5,(SourceRange)ZEXT816(0));
        ConstantValue::toString_abi_cxx11_(&local_58,this_00);
        ::fmt::v9::detail::buffer<char>::append<char>
                  ((buffer<char> *)pFVar1,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      ::fmt::v9::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,",","");
      lVar9 = lVar9 + 8;
    } while (sVar3 << 3 != lVar9);
    pFVar1 = (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    uVar10 = *(size_t *)((long)&(pFVar1->buf).super_buffer<char> + 0x10) - 1;
    if (*(size_t *)((long)&(pFVar1->buf).super_buffer<char> + 0x18) < uVar10) {
      (*(code *)*(pFVar1->buf).super_buffer<char>._vptr_buffer)(pFVar1,uVar10);
    }
    uVar6 = *(size_t *)((long)&(pFVar1->buf).super_buffer<char> + 0x18);
    if (uVar6 < uVar10) {
      uVar10 = uVar6;
    }
    *(ulong *)((long)&(pFVar1->buf).super_buffer<char> + 0x10) = uVar10;
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,")","");
    type = local_38;
  }
  pMVar7 = type->modport;
  if (pMVar7 != (ModportSymbol *)0x0) {
    local_58._M_string_length = (pMVar7->super_Symbol).name._M_len;
    local_58._M_dataplus._M_p = (pMVar7->super_Symbol).name._M_str;
    fmt_00.size_ = 3;
    fmt_00.data_ = ".{}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_58;
    args_00.desc_ = 0xd;
    ::fmt::v9::detail::vformat_to<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt_00,args_00,
               (locale_ref)0x0);
  }
  return;
}

Assistant:

void TypePrinter::visit(const VirtualInterfaceType& type, string_view) {
    buffer->append(type.iface.getDefinition().name);

    auto params = type.iface.body.parameters;
    if (!params.empty()) {
        buffer->append("#(");
        for (auto param : params) {
            buffer->format("{}=", param->symbol.name);
            if (param->symbol.kind == SymbolKind::TypeParameter)
                append(param->symbol.as<TypeParameterSymbol>().targetType.getType());
            else
                buffer->append(param->symbol.as<ParameterSymbol>().getValue().toString());
            buffer->append(",");
        }

        buffer->pop_back();
        buffer->append(")");
    }

    if (type.modport)
        buffer->format(".{}", type.modport->name);
}